

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

bool __thiscall
iutest::detail::PropertyMatcher<int(test::syntax_tests::X::*)()const,int>::
Check<test::syntax_tests::X*>
          (PropertyMatcher<int(test::syntax_tests::X::*)()const,int> *this,X **actual,type **param_2
          )

{
  code *pcVar1;
  int local_4c;
  EqMatcher<int> local_48;
  AssertionResult local_38;
  
  local_48.m_expected = (int *)(this + 0x10);
  local_48.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_003a9d48;
  pcVar1 = (code *)**(ulong **)(this + 8);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(*actual)->a + (*(ulong **)(this + 8))[1]) + -1);
  }
  local_4c = (*pcVar1)();
  EqMatcher<int>::operator()(&local_38,&local_48,&local_4c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  return local_38.m_result;
}

Assistant:

bool Check(const U& actual
        , typename detail::enable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)((actual->*m_property)()));
    }